

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * soul::makeSafeIdentifierName(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *c;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char cVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar4 = (s->_M_dataplus)._M_p;
  pcVar6 = pcVar4;
  pcVar5 = pcVar4;
  if (s->_M_string_length != 0) {
    pcVar5 = pcVar4 + s->_M_string_length;
    do {
      cVar10 = ' ';
      lVar9 = 1;
      do {
        if (cVar10 == *pcVar4) {
          *pcVar4 = '_';
          break;
        }
        cVar10 = " ,./;"[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 6);
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar5);
    pcVar5 = (s->_M_dataplus)._M_p;
    uVar2 = s->_M_string_length;
    pcVar4 = pcVar5 + uVar2;
    pcVar6 = pcVar5;
    if (0 < (long)uVar2 >> 2) {
      pcVar6 = pcVar5 + (uVar2 & 0xfffffffffffffffc);
      lVar9 = ((long)uVar2 >> 2) + 1;
      pcVar8 = pcVar5 + 3;
      do {
        cVar10 = pcVar8[-3];
        if ((((0x19 < (byte)(cVar10 + 0x9fU)) && ((byte)(cVar10 - 0x3aU) < 0xf6)) && (cVar10 != '_')
            ) && ((byte)(cVar10 + 0xa5U) < 0xe6)) {
          pcVar8 = pcVar8 + -3;
          goto LAB_0019b57b;
        }
        cVar10 = pcVar8[-2];
        if (((0x19 < (byte)(cVar10 + 0x9fU)) && ((byte)(cVar10 - 0x3aU) < 0xf6)) &&
           ((cVar10 != '_' && ((byte)(cVar10 + 0xa5U) < 0xe6)))) {
          pcVar8 = pcVar8 + -2;
          goto LAB_0019b57b;
        }
        cVar10 = pcVar8[-1];
        if (((0x19 < (byte)(cVar10 + 0x9fU)) && ((byte)(cVar10 - 0x3aU) < 0xf6)) &&
           ((cVar10 != '_' && ((byte)(cVar10 + 0xa5U) < 0xe6)))) {
          pcVar8 = pcVar8 + -1;
          goto LAB_0019b57b;
        }
        cVar10 = *pcVar8;
        if ((((0x19 < (byte)(cVar10 + 0x9fU)) && ((byte)(cVar10 - 0x3aU) < 0xf6)) && (cVar10 != '_')
            ) && ((byte)(cVar10 + 0xa5U) < 0xe6)) goto LAB_0019b57b;
        lVar9 = lVar9 + -1;
        pcVar8 = pcVar8 + 4;
      } while (1 < lVar9);
    }
  }
  lVar9 = (long)pcVar4 - (long)pcVar6;
  pcVar7 = pcVar4;
  if (lVar9 == 1) {
LAB_0019b4fd:
    cVar10 = *pcVar6;
    if (((((byte)(cVar10 + 0x9fU) < 0x1a) || (0xf5 < (byte)(cVar10 - 0x3aU))) || (cVar10 == '_')) ||
       (pcVar8 = pcVar6, 0xe5 < (byte)(cVar10 + 0xa5U))) goto LAB_0019b5c9;
  }
  else if (lVar9 == 2) {
LAB_0019b4ee:
    cVar10 = *pcVar6;
    if ((((byte)(cVar10 + 0x9fU) < 0x1a) || (0xf5 < (byte)(cVar10 - 0x3aU))) ||
       ((cVar10 == '_' || (pcVar8 = pcVar6, 0xe5 < (byte)(cVar10 + 0xa5U))))) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0019b4fd;
    }
  }
  else {
    if (lVar9 != 3) goto LAB_0019b5c9;
    cVar10 = *pcVar6;
    if ((((byte)(cVar10 + 0x9fU) < 0x1a) || (0xf5 < (byte)(cVar10 - 0x3aU))) ||
       ((cVar10 == '_' || (pcVar8 = pcVar6, 0xe5 < (byte)(cVar10 + 0xa5U))))) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0019b4ee;
    }
  }
LAB_0019b57b:
  pcVar7 = pcVar8;
  pcVar6 = pcVar7 + 1;
  if (pcVar6 != pcVar4 && pcVar7 != pcVar4) {
    do {
      cVar10 = *pcVar6;
      if ((((byte)(cVar10 + 0x9fU) < 0x1a) || (0xf5 < (byte)(cVar10 - 0x3aU))) ||
         ((cVar10 == '_' || (0xe5 < (byte)(cVar10 + 0xa5U))))) {
        *pcVar7 = cVar10;
        pcVar7 = pcVar7 + 1;
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar4);
    pcVar5 = (s->_M_dataplus)._M_p;
  }
LAB_0019b5c9:
  s->_M_string_length = (long)pcVar7 - (long)pcVar5;
  *pcVar7 = '\0';
  pcVar4 = (s->_M_dataplus)._M_p;
  if ((byte)(*pcVar4 - 0x30U) < 10) {
    std::operator+(&local_38,"_",s);
    std::__cxx11::string::operator=((string *)s,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (s->_M_dataplus)._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string makeSafeIdentifierName (std::string s)
{
    for (auto& c : s)
        if (containsChar (" ,./;", c))
            c = '_';

    s.erase (std::remove_if (s.begin(), s.end(), [&] (char c) { return ! isSafeIdentifierChar (c); }), s.end());

    // Identifiers can't start with a digit
    if (isDigit (s[0]))
        s = "_" + s;

    return s;
}